

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManComputeCuts(Nf_Man_t *p)

{
  int iVar1;
  bool bVar2;
  float a;
  int local_1c;
  int iFanin;
  int i;
  Gia_Obj_t *pObj;
  Nf_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->pGia->nObjs) {
      _iFanin = Gia_ManObj(p->pGia,local_1c);
      bVar2 = _iFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(_iFanin);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsBuf(_iFanin);
      if (iVar1 == 0) {
        Nf_ObjMergeOrder(p,local_1c);
      }
      else {
        iVar1 = Gia_ObjFaninId0(_iFanin,local_1c);
        a = Nf_ObjCutFlow(p,iVar1);
        Nf_ObjSetCutFlow(p,local_1c,a);
        iVar1 = Nf_ObjCutDelay(p,iVar1);
        Nf_ObjSetCutDelay(p,local_1c,iVar1);
      }
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Nf_ManComputeCuts( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iFanin;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0(pObj, i);
            Nf_ObjSetCutFlow( p, i,  Nf_ObjCutFlow(p, iFanin) );
            Nf_ObjSetCutDelay( p, i, Nf_ObjCutDelay(p, iFanin) );
        }
        else
            Nf_ObjMergeOrder( p, i );
}